

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_PrintWithEscapedCharacters_TestShell::
~TEST_TeamCityOutputTest_PrintWithEscapedCharacters_TestShell
          (TEST_TeamCityOutputTest_PrintWithEscapedCharacters_TestShell *this)

{
  TEST_TeamCityOutputTest_PrintWithEscapedCharacters_TestShell *this_local;
  
  ~TEST_TeamCityOutputTest_PrintWithEscapedCharacters_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TeamCityOutputTest, PrintWithEscapedCharacters)
{
    tcout->printFailure(*f3);
    const char* expected =
            "##teamcity[testFailed name='test' message='file:30' "
            "details='apos|' pipe|| |[brackets|]"
            "|r|nCRLF']\n";
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}